

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O0

Matrix * viewport(Matrix *__return_storage_ptr__,float x,float y,float w,float h)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  reference pvVar2;
  float h_local;
  float w_local;
  float y_local;
  float x_local;
  Matrix *Viewport;
  
  Matrix::identity(__return_storage_ptr__,4);
  pvVar1 = Matrix::operator[](__return_storage_ptr__,0);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,3);
  *pvVar2 = x + w * 0.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,1);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,3);
  *pvVar2 = y + h * 0.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,2);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,3);
  *pvVar2 = 127.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,0);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,0);
  *pvVar2 = w * 0.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,1);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,1);
  *pvVar2 = h * 0.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,2);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,2);
  *pvVar2 = 127.5;
  return __return_storage_ptr__;
}

Assistant:

Matrix viewport(float x, float y, float w, float h) {
    Matrix Viewport = Matrix::identity(4);
    Viewport[0][3] = x+w/2.f;
    Viewport[1][3] = y+h/2.f;
    Viewport[2][3] = depth/2.f;
    Viewport[0][0] = w/2.f;
    Viewport[1][1] = h/2.f;
    Viewport[2][2] = depth/2.f;
    return Viewport;
}